

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 normalizeRoundAndPackFloatx80_mips
                   (int8_t roundingPrecision,flag zSign,int32_t zExp,uint64_t zSig0,uint64_t zSig1,
                   float_status *status)

{
  int iVar1;
  floatx80 fVar2;
  int8_t shiftCount;
  float_status *status_local;
  uint64_t zSig1_local;
  uint64_t zSig0_local;
  int32_t zExp_local;
  flag zSign_local;
  int8_t roundingPrecision_local;
  
  status_local = (float_status *)zSig1;
  zSig1_local = zSig0;
  zSig0_local._0_4_ = zExp;
  if (zSig0 == 0) {
    status_local = (float_status *)0x0;
    zSig0_local._0_4_ = zExp + -0x40;
    zSig1_local = zSig1;
  }
  zSig0_local._6_1_ = zSign;
  zSig0_local._7_1_ = roundingPrecision;
  iVar1 = clz64(zSig1_local);
  shortShift128Left(zSig1_local,(uint64_t)status_local,(int)(char)iVar1,&zSig1_local,
                    (uint64_t *)&status_local);
  zSig0_local._0_4_ = (int32_t)zSig0_local - (char)iVar1;
  fVar2 = roundAndPackFloatx80_mips
                    (zSig0_local._7_1_,zSig0_local._6_1_,(int32_t)zSig0_local,zSig1_local,
                     (uint64_t)status_local,status);
  return fVar2;
}

Assistant:

floatx80 normalizeRoundAndPackFloatx80(int8_t roundingPrecision,
                                       flag zSign, int32_t zExp,
                                       uint64_t zSig0, uint64_t zSig1,
                                       float_status *status)
{
    int8_t shiftCount;

    if ( zSig0 == 0 ) {
        zSig0 = zSig1;
        zSig1 = 0;
        zExp -= 64;
    }
    shiftCount = clz64(zSig0);
    shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
    zExp -= shiftCount;
    return roundAndPackFloatx80(roundingPrecision, zSign, zExp,
                                zSig0, zSig1, status);

}